

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlTextWriterWriteDTD(void)

{
  int iVar1;
  int iVar2;
  xmlTextWriterPtr val;
  xmlChar *val_00;
  xmlChar *val_01;
  xmlChar *val_02;
  xmlChar *val_03;
  int local_64;
  int n_subset;
  xmlChar *subset;
  int n_sysid;
  xmlChar *sysid;
  int n_pubid;
  xmlChar *pubid;
  int n_name;
  xmlChar *name;
  int n_writer;
  xmlTextWriterPtr writer;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 2; name._4_4_ = name._4_4_ + 1) {
    for (pubid._4_4_ = 0; (int)pubid._4_4_ < 5; pubid._4_4_ = pubid._4_4_ + 1) {
      for (sysid._4_4_ = 0; (int)sysid._4_4_ < 5; sysid._4_4_ = sysid._4_4_ + 1) {
        for (subset._4_4_ = 0; (int)subset._4_4_ < 5; subset._4_4_ = subset._4_4_ + 1) {
          for (local_64 = 0; local_64 < 5; local_64 = local_64 + 1) {
            iVar1 = xmlMemBlocks();
            val = gen_xmlTextWriterPtr(name._4_4_,0);
            val_00 = gen_const_xmlChar_ptr(pubid._4_4_,1);
            val_01 = gen_const_xmlChar_ptr(sysid._4_4_,2);
            val_02 = gen_const_xmlChar_ptr(subset._4_4_,3);
            val_03 = gen_const_xmlChar_ptr(local_64,4);
            iVar2 = xmlTextWriterWriteDTD(val,val_00,val_01,val_02,val_03);
            desret_int(iVar2);
            call_tests = call_tests + 1;
            des_xmlTextWriterPtr(name._4_4_,val,0);
            des_const_xmlChar_ptr(pubid._4_4_,val_00,1);
            des_const_xmlChar_ptr(sysid._4_4_,val_01,2);
            des_const_xmlChar_ptr(subset._4_4_,val_02,3);
            des_const_xmlChar_ptr(local_64,val_03,4);
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar1 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextWriterWriteDTD",(ulong)(uint)(iVar2 - iVar1)
                    );
              ret_val = ret_val + 1;
              printf(" %d",(ulong)name._4_4_);
              printf(" %d",(ulong)pubid._4_4_);
              printf(" %d",(ulong)sysid._4_4_);
              printf(" %d",(ulong)subset._4_4_);
              printf(" %d");
              printf("\n");
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlTextWriterWriteDTD(void) {
    int test_ret = 0;

#if defined(LIBXML_WRITER_ENABLED)
    int mem_base;
    int ret_val;
    xmlTextWriterPtr writer; /* the xmlTextWriterPtr */
    int n_writer;
    xmlChar * name; /* the name of the DTD */
    int n_name;
    xmlChar * pubid; /* the public identifier, which is an alternative to the system identifier */
    int n_pubid;
    xmlChar * sysid; /* the system identifier, which is the URI of the DTD */
    int n_sysid;
    xmlChar * subset; /* string content of the DTD */
    int n_subset;

    for (n_writer = 0;n_writer < gen_nb_xmlTextWriterPtr;n_writer++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_pubid = 0;n_pubid < gen_nb_const_xmlChar_ptr;n_pubid++) {
    for (n_sysid = 0;n_sysid < gen_nb_const_xmlChar_ptr;n_sysid++) {
    for (n_subset = 0;n_subset < gen_nb_const_xmlChar_ptr;n_subset++) {
        mem_base = xmlMemBlocks();
        writer = gen_xmlTextWriterPtr(n_writer, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);
        pubid = gen_const_xmlChar_ptr(n_pubid, 2);
        sysid = gen_const_xmlChar_ptr(n_sysid, 3);
        subset = gen_const_xmlChar_ptr(n_subset, 4);

        ret_val = xmlTextWriterWriteDTD(writer, (const xmlChar *)name, (const xmlChar *)pubid, (const xmlChar *)sysid, (const xmlChar *)subset);
        desret_int(ret_val);
        call_tests++;
        des_xmlTextWriterPtr(n_writer, writer, 0);
        des_const_xmlChar_ptr(n_name, (const xmlChar *)name, 1);
        des_const_xmlChar_ptr(n_pubid, (const xmlChar *)pubid, 2);
        des_const_xmlChar_ptr(n_sysid, (const xmlChar *)sysid, 3);
        des_const_xmlChar_ptr(n_subset, (const xmlChar *)subset, 4);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlTextWriterWriteDTD",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_writer);
            printf(" %d", n_name);
            printf(" %d", n_pubid);
            printf(" %d", n_sysid);
            printf(" %d", n_subset);
            printf("\n");
        }
    }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}